

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_left_delim_join.cpp
# Opt level: O1

void __thiscall
duckdb::PhysicalLeftDelimJoin::PhysicalLeftDelimJoin
          (PhysicalLeftDelimJoin *this,PhysicalPlanGenerator *planner,
          vector<duckdb::LogicalType,_true> *types,PhysicalOperator *original_join,
          PhysicalOperator *distinct,
          vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> *delim_scans,
          idx_t estimated_cardinality,optional_idx delim_idx)

{
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *this_00;
  pointer *pprVar1;
  iterator __position;
  reference pvVar2;
  pointer this_01;
  PhysicalOperator *pPVar3;
  pointer prVar4;
  PhysicalColumnDataScan *cast_cached_scan;
  PhysicalOperatorType local_41;
  void *local_40;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_38;
  
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PhysicalDelimJoin::PhysicalDelimJoin
            (&this->super_PhysicalDelimJoin,LEFT_DELIM_JOIN,
             (vector<duckdb::LogicalType,_true> *)&local_38,original_join,distinct,delim_scans,
             estimated_cardinality,delim_idx);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_38);
  (this->super_PhysicalDelimJoin).super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalDelimJoin_024a4950;
  pvVar2 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&((this->super_PhysicalDelimJoin).join)->children,0);
  this_00 = &(this->super_PhysicalDelimJoin).super_PhysicalOperator.children;
  __position._M_current =
       *(pointer *)
        ((long)&(this->super_PhysicalDelimJoin).super_PhysicalOperator.children.
                super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (__position._M_current ==
      *(pointer *)
       ((long)&(this->super_PhysicalDelimJoin).super_PhysicalOperator.children.
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>const&>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)this_00,__position,pvVar2);
  }
  else {
    (__position._M_current)->_M_data = pvVar2->_M_data;
    pprVar1 = (pointer *)
              ((long)&(this->super_PhysicalDelimJoin).super_PhysicalOperator.children.
                      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    *pprVar1 = *pprVar1 + 1;
  }
  pvVar2 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_00,0);
  pPVar3 = pvVar2->_M_data;
  local_41 = COLUMN_DATA_SCAN;
  local_40 = (void *)0x0;
  this_01 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
            operator->(&planner->physical_plan);
  pPVar3 = PhysicalPlan::
           Make<duckdb::PhysicalColumnDataScan,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::PhysicalOperatorType,unsigned_long&,decltype(nullptr)>
                     (this_01,&pPVar3->types,&local_41,&estimated_cardinality,&local_40);
  if (delim_idx.index != 0xffffffffffffffff) {
    prVar4 = (pointer)optional_idx::GetIndex(&delim_idx);
    pPVar3[1].children.
    super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
    ._M_impl.super__Vector_impl_data._M_start = prVar4;
  }
  pvVar2 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&((this->super_PhysicalDelimJoin).join)->children,0);
  pvVar2->_M_data = pPVar3;
  return;
}

Assistant:

PhysicalLeftDelimJoin::PhysicalLeftDelimJoin(PhysicalPlanGenerator &planner, vector<LogicalType> types,
                                             PhysicalOperator &original_join, PhysicalOperator &distinct,
                                             const vector<const_reference<PhysicalOperator>> &delim_scans,
                                             idx_t estimated_cardinality, optional_idx delim_idx)
    : PhysicalDelimJoin(PhysicalOperatorType::LEFT_DELIM_JOIN, std::move(types), original_join, distinct, delim_scans,
                        estimated_cardinality, delim_idx) {
	D_ASSERT(join.children.size() == 2);
	// now for the original join
	// we take its left child, this is the side that we will duplicate eliminate
	children.push_back(join.children[0]);

	// we replace it with a PhysicalColumnDataScan, that scans the ColumnDataCollection that we keep cached
	// the actual chunk collection to scan will be created in the LeftDelimJoinGlobalState
	auto &cached_scan = planner.Make<PhysicalColumnDataScan>(
	    children[0].get().GetTypes(), PhysicalOperatorType::COLUMN_DATA_SCAN, estimated_cardinality, nullptr);
	if (delim_idx.IsValid()) {
		auto &cast_cached_scan = cached_scan.Cast<PhysicalColumnDataScan>();
		cast_cached_scan.cte_index = delim_idx.GetIndex();
	}
	join.children[0] = cached_scan;
}